

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolve.cpp
# Opt level: O1

Matrix * __thiscall TriangularSolve::solve(TriangularSolve *this,Matrix *L,Matrix *d,int dia)

{
  int iVar1;
  Matrix *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  double dVar7;
  string local_50;
  
  this_00 = (Matrix *)operator_new(0x30);
  iVar1 = this->rowNo;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"y(Unknowns):","");
  Matrix::Matrix(this_00,iVar1,1,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar1 = this->rowNo;
  if (0 < (long)iVar1) {
    lVar2 = (long)(dia / 2);
    lVar3 = -8;
    lVar4 = 0;
    do {
      dVar7 = 0.0;
      if (lVar4 <= lVar2) {
        if (lVar4 != 0) {
          lVar6 = 0;
          do {
            dVar7 = dVar7 + L->array[lVar4][lVar6] * *this_00->array[lVar6];
            lVar6 = lVar6 + 1;
          } while (lVar4 != lVar6);
        }
        *this_00->array[lVar4] = (*d->array[lVar4] - dVar7) / L->array[lVar4][lVar4];
      }
      if (lVar2 < lVar4) {
        if (1 < dia) {
          puVar5 = (undefined8 *)((long)this_00->array + lVar3);
          lVar6 = lVar2 + 1;
          do {
            dVar7 = dVar7 + L->array[lVar4][lVar6 + -2] * *(double *)*puVar5;
            lVar6 = lVar6 + -1;
            puVar5 = puVar5 + -1;
          } while (1 < lVar6);
        }
        *this_00->array[lVar4] = (*d->array[lVar4] - dVar7) / L->array[lVar4][lVar2];
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar4 != iVar1);
  }
  return this_00;
}

Assistant:

Matrix* TriangularSolve::solve(Matrix *L, Matrix *d, int dia)
{
    Matrix *y = new Matrix(rowNo, 1, "y(Unknowns):");
    double s = 0;
    int c=0;
    int d1 = dia/2;

    for(int i=0; i<rowNo; i++)
    {
        if(i<=d1)
        {
            for(int j=0; j<i ; j++)
            {
               s += L->array[i][j]*y->array[j][0];
            }
          y->array[i][0] = (d->array[i][0] - s) / L->array[i][i];

        }
         if(i>d1)
        {
            for (int j = i-1; j > j-d1; j--)
            {
                d1--;
                s += L->array[i][d1]*y->array[j][0];
            }
          d1=dia/2;
          y->array[i][0] = (d->array[i][0] - s) / L->array[i][d1];
        }

        s = 0;
    }
    return y;
}